

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O0

void __thiscall HEkkPrimal::reportRebuild(HEkkPrimal *this,HighsInt reason_for_rebuild)

{
  undefined4 in_ESI;
  long *in_RDI;
  HEkkPrimal *in_stack_ffffffffffffffd0;
  HighsInt in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  HighsInt in_stack_ffffffffffffffe4;
  HEkk *in_stack_ffffffffffffffe8;
  
  HighsSimplexAnalysis::simplexTimerStart
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  iterationAnalysisData(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI[1] + 0x118) = in_ESI;
  HEkk::rebuildReason_abi_cxx11_(in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4);
  std::__cxx11::string::operator=((string *)(in_RDI[1] + 0x120),(string *)&stack0xffffffffffffffd0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  if ((*(byte *)(*(long *)(*in_RDI + 8) + 0x1d8) & 1) != 0) {
    HighsSimplexAnalysis::invertReport
              ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0)
              );
  }
  HighsSimplexAnalysis::simplexTimerStop
            ((HighsSimplexAnalysis *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void HEkkPrimal::reportRebuild(const HighsInt reason_for_rebuild) {
  analysis->simplexTimerStart(ReportRebuildClock);
  iterationAnalysisData();
  analysis->rebuild_reason = reason_for_rebuild;
  analysis->rebuild_reason_string =
      ekk_instance_.rebuildReason(reason_for_rebuild);
  if (ekk_instance_.options_->output_flag) analysis->invertReport();
  analysis->simplexTimerStop(ReportRebuildClock);
}